

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QUrl __thiscall
QFileDialog::getSaveFileUrl
          (QFileDialog *this,QWidget *parent,QString *caption,QUrl *dir,QString *filter,
          QString *selectedFilter,Options options,QStringList *supportedSchemes)

{
  QArrayData *pQVar1;
  QUrl *pQVar2;
  qsizetype qVar3;
  int iVar4;
  QObject *this_00;
  Data *pDVar5;
  long in_FS_OFFSET;
  QFileDialogArgs args;
  QArrayDataPointer<QUrl> local_c8;
  QAutoPointer<QFileDialog> local_a8;
  undefined1 local_98 [96];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileDialogArgs::QFileDialogArgs((QFileDialogArgs *)local_98,dir);
  local_98._0_8_ = parent;
  QString::operator=((QString *)(local_98 + 8),(QString *)caption);
  QString::operator=((QString *)(local_98 + 0x40),(QString *)filter);
  local_98._88_8_ =
       (ulong)(uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                    super_QFlagsStorage<QFileDialog::Option>.i << 0x20;
  this_00 = (QObject *)operator_new(0x28);
  QFileDialog((QFileDialog *)this_00,(QFileDialogArgs *)local_98);
  pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(this_00);
  local_a8.o.wp.d = pDVar5;
  local_a8.o.wp.value = this_00;
  QFileDialogOptions::setSupportedSchemes(*(QList_conflict **)(*(long *)(this_00 + 8) + 0x3d0));
  setAcceptMode((QFileDialog *)this_00,AcceptSave);
  if ((selectedFilter != (QString *)0x0) && ((selectedFilter->d).size != 0)) {
    selectNameFilter((QFileDialog *)this_00,selectedFilter);
  }
  iVar4 = (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
  if ((*(int *)(pDVar5 + 4) == 0) || (iVar4 != 1)) {
    QUrl::QUrl((QUrl *)this);
  }
  else {
    if (selectedFilter != (QString *)0x0) {
      selectedNameFilter((QString *)&local_c8,(QFileDialog *)this_00);
      pQVar1 = &((selectedFilter->d).d)->super_QArrayData;
      pQVar2 = (QUrl *)(selectedFilter->d).ptr;
      (selectedFilter->d).d = (Data *)local_c8.d;
      (selectedFilter->d).ptr = (char16_t *)local_c8.ptr;
      qVar3 = (selectedFilter->d).size;
      (selectedFilter->d).size = local_c8.size;
      this_00 = local_a8.o.wp.value;
      local_c8.d = (Data *)pQVar1;
      local_c8.ptr = pQVar2;
      local_c8.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
          this_00 = local_a8.o.wp.value;
        }
      }
    }
    selectedUrls((QList<QUrl> *)&local_c8,(QFileDialog *)this_00);
    QList<QUrl>::value((QList<QUrl> *)this,(qsizetype)&local_c8);
    QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_c8);
  }
  QAutoPointer<QFileDialog>::~QAutoPointer(&local_a8);
  if ((QArrayData *)local_98._64_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._64_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._64_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._64_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._64_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._40_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._40_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._40_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._40_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._40_8_,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)(local_98 + 0x20));
  if ((QArrayData *)local_98._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._8_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QFileDialog::getSaveFileUrl(QWidget *parent,
                                 const QString &caption,
                                 const QUrl &dir,
                                 const QString &filter,
                                 QString *selectedFilter,
                                 Options options,
                                 const QStringList &supportedSchemes)
{
    QFileDialogArgs args(dir);
    args.parent = parent;
    args.caption = caption;
    args.filter = filter;
    args.mode = AnyFile;
    args.options = options;

    QAutoPointer<QFileDialog> dialog(new QFileDialog(args));
    dialog->setSupportedSchemes(supportedSchemes);
    dialog->setAcceptMode(AcceptSave);
    if (selectedFilter && !selectedFilter->isEmpty())
        dialog->selectNameFilter(*selectedFilter);
    const int execResult = dialog->exec();
    if (bool(dialog) && execResult == QDialog::Accepted) {
        if (selectedFilter)
            *selectedFilter = dialog->selectedNameFilter();
        return dialog->selectedUrls().value(0);
    }
    return QUrl();
}